

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpconv.cpp
# Opt level: O0

Fp build_fp(double d)

{
  uint uVar1;
  uint64_t uVar2;
  double in_XMM0_Qa;
  Fp FVar3;
  uint64_t bits;
  Fp fp;
  undefined8 local_10;
  undefined4 local_8;
  
  uVar2 = get_dbits(in_XMM0_Qa);
  local_10 = uVar2 & 0xfffffffffffff;
  uVar1 = ((uint)(uVar2 >> 0x20) & 0x7ff00000) >> 0x14;
  if (uVar1 == 0) {
    local_8 = -0x432;
  }
  else {
    local_10 = local_10 + 0x10000000000000;
    local_8 = uVar1 - 0x433;
  }
  FVar3.exp = local_8;
  FVar3.frac = local_10;
  FVar3._12_4_ = 0;
  return FVar3;
}

Assistant:

static Fp build_fp(double d) {
  uint64_t bits = get_dbits(d);

  Fp fp;
  fp.frac = bits & fracmask;
  fp.exp = (bits & expmask) >> 52;

  if (fp.exp) {
    fp.frac += hiddenbit;
    fp.exp -= expbias;

  } else {
    fp.exp = -expbias + 1;
  }

  return fp;
}